

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
               *this,size_t bucket_cnt,hasher *hashfn,key_equal *eq,allocator_type *alloc)

{
  ctrl_t *pcVar1;
  allocator<cs::signal_types> *capacity;
  size_t sVar2;
  long in_RSI;
  allocator<cs::signal_types> *in_RDI;
  size_t new_capacity;
  allocator<cs::signal_types> *in_stack_ffffffffffffff98;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  *this_00;
  size_t in_stack_ffffffffffffffc8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  *in_stack_ffffffffffffffd0;
  
  pcVar1 = EmptyGroup();
  *(ctrl_t **)in_RDI = pcVar1;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  capacity = in_RDI + 0x28;
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
             *)&stack0xffffffffffffffd5;
  std::allocator<cs::signal_types>::allocator(in_RDI,in_stack_ffffffffffffff98);
  CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  ::CompressedTuple((CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                     *)capacity,0,this_00);
  std::allocator<cs::signal_types>::~allocator((allocator<cs::signal_types> *)0x588d5b);
  if (in_RSI != 0) {
    sVar2 = NormalizeCapacity((size_t)in_RDI);
    reset_growth_left(this_00,(size_t)capacity);
    initialize_slots(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(size_t *)(in_RDI + 0x18) = sVar2;
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_cnt, const hasher& hashfn = hasher(),
			                      const key_equal& eq = key_equal(),
			                      const allocator_type& alloc = allocator_type())
				: ctrl_(EmptyGroup()), settings_(0, hashfn, eq, alloc)
			{
				if (bucket_cnt) {
					size_t new_capacity = NormalizeCapacity(bucket_cnt);
					reset_growth_left(new_capacity);
					initialize_slots(new_capacity);
					capacity_ = new_capacity;
				}
			}